

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rANS_static.c
# Opt level: O0

uchar * rans_uncompress_O0(uchar *in,uint in_size,uint *out_size)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  uint uVar5;
  byte *pbVar6;
  uint32_t uVar7;
  uint8_t c [4];
  uint32_t m [4];
  uint local_c88;
  uint32_t mask;
  RansState R [4];
  byte *pbStack_c70;
  int out_end;
  uint8_t *ptr;
  RansState rans3;
  RansState rans2;
  RansState rans1;
  RansState rans0;
  RansDecSymbol syms [256];
  ari_decoder D;
  char *out_buf;
  int rle;
  int in_sz;
  int out_sz;
  int x;
  int j;
  int i;
  uchar *cp;
  uint *out_size_local;
  uint in_size_local;
  uchar *in_local;
  
  memset(syms + 0xfe,0,0x808);
  if (*in == '\0') {
    uVar5 = *(uint *)(in + 5);
    if (*(int *)(in + 1) == in_size - 9) {
      in_local = (uchar *)malloc((long)(int)uVar5);
      if (in_local == (uchar *)0x0) {
        in_local = (uchar *)0x0;
      }
      else {
        in_sz = 0;
        out_buf._0_4_ = 0;
        _j = in + 10;
        out_sz = (int)in[9];
        do {
          bVar1 = *_j;
          D.fc[(long)out_sz + -1].F = (uint)bVar1;
          pbVar6 = _j + 1;
          if (0x7f < bVar1) {
            D.fc[(long)out_sz + -1].F = D.fc[(long)out_sz + -1].F & 0xffffff7f;
            D.fc[(long)out_sz + -1].F = (D.fc[(long)out_sz + -1].F & 0x7fU) << 8 | (uint)_j[1];
            pbVar6 = _j + 2;
          }
          _j = pbVar6;
          D.fc[(long)out_sz + -1].C = in_sz;
          RansDecSymbolInit((RansDecSymbol *)(&rans1 + out_sz),D.fc[(long)out_sz + -1].C,
                            D.fc[(long)out_sz + -1].F);
          if (D.fc[0xff] == (anon_struct_8_2_94730ba2)0x0) {
            D.fc[0xff] = (anon_struct_8_2_94730ba2)malloc(0x1000);
          }
          memset((void *)((long)D.fc[0xff] + (long)in_sz),out_sz & 0xff,
                 (long)D.fc[(long)out_sz + -1].F);
          in_sz = D.fc[(long)out_sz + -1].F + in_sz;
          if (((uint)out_buf == 0) && (out_sz + 1U == (uint)*_j)) {
            out_sz = (int)*_j;
            out_buf._0_4_ = (uint)_j[1];
            _j = _j + 2;
          }
          else if ((uint)out_buf == 0) {
            out_sz = (int)*_j;
            _j = _j + 1;
          }
          else {
            out_buf._0_4_ = (uint)out_buf - 1;
            out_sz = out_sz + 1;
          }
        } while (out_sz != 0);
        if (0xfff < in_sz) {
          __assert_fail("x < TOTFREQ",
                        "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/cram/rANS_static.c"
                        ,0x102,
                        "unsigned char *rans_uncompress_O0(unsigned char *, unsigned int, unsigned int *)"
                       );
        }
        pbStack_c70 = _j;
        RansDecInit(&rans2,&stack0xfffffffffffff390);
        RansDecInit(&rans3,&stack0xfffffffffffff390);
        RansDecInit((RansState *)((long)&ptr + 4),&stack0xfffffffffffff390);
        RansDecInit((RansState *)&ptr,&stack0xfffffffffffff390);
        R[3] = uVar5 & 0xfffffffc;
        local_c88 = rans2;
        mask = rans3;
        R[0] = ptr._4_4_;
        R[1] = (RansState)ptr;
        for (x = 0; x < (int)R[3]; x = x + 4) {
          bVar1 = *(byte *)((long)D.fc[0xff] + (ulong)(local_c88 & 0xfff));
          bVar2 = *(byte *)((long)D.fc[0xff] + (ulong)(mask & 0xfff));
          bVar3 = *(byte *)((long)D.fc[0xff] + (ulong)(R[0] & 0xfff));
          bVar4 = *(byte *)((long)D.fc[0xff] + (ulong)(R[1] & 0xfff));
          in_local[x] = bVar1;
          in_local[x + 1] = bVar2;
          in_local[x + 2] = bVar3;
          in_local[x + 3] = bVar4;
          local_c88 = ((local_c88 & 0xfff) - (uint)(ushort)(&rans1)[bVar1]) +
                      (uint)*(ushort *)((long)&rans1 + (ulong)bVar1 * 4 + 2) * (local_c88 >> 0xc);
          mask = ((mask & 0xfff) - (uint)(ushort)(&rans1)[bVar2]) +
                 (uint)*(ushort *)((long)&rans1 + (ulong)bVar2 * 4 + 2) * (mask >> 0xc);
          R[0] = ((R[0] & 0xfff) - (uint)(ushort)(&rans1)[bVar3]) +
                 (uint)*(ushort *)((long)&rans1 + (ulong)bVar3 * 4 + 2) * (R[0] >> 0xc);
          R[1] = ((R[1] & 0xfff) - (uint)(ushort)(&rans1)[bVar4]) +
                 (uint)*(ushort *)((long)&rans1 + (ulong)bVar4 * 4 + 2) * (R[1] >> 0xc);
          RansDecRenorm(&local_c88,&stack0xfffffffffffff390);
          RansDecRenorm(&mask,&stack0xfffffffffffff390);
          RansDecRenorm(R,&stack0xfffffffffffff390);
          RansDecRenorm(R + 1,&stack0xfffffffffffff390);
        }
        rans2 = local_c88;
        rans3 = mask;
        ptr._4_4_ = R[0];
        ptr._0_4_ = R[1];
        switch(uVar5 & 3) {
        case 0:
          break;
        case 1:
          uVar7 = RansDecGet(&rans2,0xc);
          bVar1 = *(byte *)((long)D.fc[0xff] + (ulong)uVar7);
          RansDecAdvanceSymbol
                    (&rans2,&stack0xfffffffffffff390,(RansDecSymbol *)(&rans1 + bVar1),0xc);
          in_local[(int)R[3]] = bVar1;
          break;
        case 2:
          uVar7 = RansDecGet(&rans2,0xc);
          bVar1 = *(byte *)((long)D.fc[0xff] + (ulong)uVar7);
          RansDecAdvanceSymbol
                    (&rans2,&stack0xfffffffffffff390,(RansDecSymbol *)(&rans1 + bVar1),0xc);
          in_local[(int)R[3]] = bVar1;
          uVar7 = RansDecGet(&rans3,0xc);
          bVar1 = *(byte *)((long)D.fc[0xff] + (ulong)uVar7);
          RansDecAdvanceSymbol
                    (&rans3,&stack0xfffffffffffff390,(RansDecSymbol *)(&rans1 + bVar1),0xc);
          in_local[(int)(R[3] + 1)] = bVar1;
          break;
        case 3:
          uVar7 = RansDecGet(&rans2,0xc);
          bVar1 = *(byte *)((long)D.fc[0xff] + (ulong)uVar7);
          RansDecAdvanceSymbol
                    (&rans2,&stack0xfffffffffffff390,(RansDecSymbol *)(&rans1 + bVar1),0xc);
          in_local[(int)R[3]] = bVar1;
          uVar7 = RansDecGet(&rans3,0xc);
          bVar1 = *(byte *)((long)D.fc[0xff] + (ulong)uVar7);
          RansDecAdvanceSymbol
                    (&rans3,&stack0xfffffffffffff390,(RansDecSymbol *)(&rans1 + bVar1),0xc);
          in_local[(int)(R[3] + 1)] = bVar1;
          uVar7 = RansDecGet((RansState *)((long)&ptr + 4),0xc);
          bVar1 = *(byte *)((long)D.fc[0xff] + (ulong)uVar7);
          RansDecAdvanceSymbol
                    ((RansState *)((long)&ptr + 4),&stack0xfffffffffffff390,
                     (RansDecSymbol *)(&rans1 + bVar1),0xc);
          in_local[(int)(R[3] + 2)] = bVar1;
        }
        *out_size = uVar5;
        if (D.fc[0xff] != (anon_struct_8_2_94730ba2)0x0) {
          free((void *)D.fc[0xff]);
        }
      }
    }
    else {
      in_local = (uchar *)0x0;
    }
  }
  else {
    in_local = (uchar *)0x0;
  }
  return in_local;
}

Assistant:

unsigned char *rans_uncompress_O0(unsigned char *in, unsigned int in_size,
				  unsigned int *out_size) {
    /* Load in the static tables */
    unsigned char *cp = in + 9;
    int i, j, x, out_sz, in_sz, rle;
    char *out_buf;
    ari_decoder D;
    RansDecSymbol syms[256];

    memset(&D, 0, sizeof(D));

    if (*in++ != 0) // Order-0 check
	return NULL;
    
    in_sz  = ((in[0])<<0) | ((in[1])<<8) | ((in[2])<<16) | ((in[3])<<24);
    out_sz = ((in[4])<<0) | ((in[5])<<8) | ((in[6])<<16) | ((in[7])<<24);
    if (in_sz != in_size-9)
	return NULL;

    out_buf = malloc(out_sz);
    if (!out_buf)
	return NULL;

    //fprintf(stderr, "out_sz=%d\n", out_sz);

    // Precompute reverse lookup of frequency.
    rle = x = 0;
    j = *cp++;
    do {
	if ((D.fc[j].F = *cp++) >= 128) {
	    D.fc[j].F &= ~128;
	    D.fc[j].F = ((D.fc[j].F & 127) << 8) | *cp++;
	}
	D.fc[j].C = x;

	RansDecSymbolInit(&syms[j], D.fc[j].C, D.fc[j].F);

	/* Build reverse lookup table */
	if (!D.R) D.R = (unsigned char *)malloc(TOTFREQ);
	memset(&D.R[x], j, D.fc[j].F);

	x += D.fc[j].F;

	if (!rle && j+1 == *cp) {
	    j = *cp++;
	    rle = *cp++;
	} else if (rle) {
	    rle--;
	    j++;
	} else {
	    j = *cp++;
	}
    } while(j);

    assert(x < TOTFREQ);

    RansState rans0, rans1, rans2, rans3;
    uint8_t *ptr = cp;
    RansDecInit(&rans0, &ptr);
    RansDecInit(&rans1, &ptr);
    RansDecInit(&rans2, &ptr);
    RansDecInit(&rans3, &ptr);

    int out_end = (out_sz&~3);

    RansState R[4];
    R[0] = rans0;
    R[1] = rans1;
    R[2] = rans2;
    R[3] = rans3;
    uint32_t mask = (1u << TF_SHIFT)-1;

    for (i=0; i < out_end; i+=4) {
	uint32_t m[4] = {R[0] & mask,
			 R[1] & mask,
			 R[2] & mask,
			 R[3] & mask};
	uint8_t c[4] = {D.R[m[0]],
			D.R[m[1]],
			D.R[m[2]],
			D.R[m[3]]};
	out_buf[i+0] = c[0];
	out_buf[i+1] = c[1];
	out_buf[i+2] = c[2];
	out_buf[i+3] = c[3];

	// RansDecAdvanceSymbolStep(&R[0], &syms[c[0]], TF_SHIFT);
	// RansDecAdvanceSymbolStep(&R[1], &syms[c[1]], TF_SHIFT);
	// RansDecAdvanceSymbolStep(&R[2], &syms[c[2]], TF_SHIFT);
	// RansDecAdvanceSymbolStep(&R[3], &syms[c[3]], TF_SHIFT);
	R[0] = syms[c[0]].freq * (R[0]>>TF_SHIFT);
	R[1] = syms[c[1]].freq * (R[1]>>TF_SHIFT);
	R[2] = syms[c[2]].freq * (R[2]>>TF_SHIFT);
	R[3] = syms[c[3]].freq * (R[3]>>TF_SHIFT);

	R[0] += m[0] - syms[c[0]].start;
	R[1] += m[1] - syms[c[1]].start;
	R[2] += m[2] - syms[c[2]].start;
	R[3] += m[3] - syms[c[3]].start;

	RansDecRenorm(&R[0], &ptr);
	RansDecRenorm(&R[1], &ptr);
	RansDecRenorm(&R[2], &ptr);
	RansDecRenorm(&R[3], &ptr);
    }

    rans0 = R[0];
    rans1 = R[1];
    rans2 = R[2];
    rans3 = R[3];

    switch(out_sz&3) {
	unsigned char c;
    case 0:
	break;
    case 1:
	c = D.R[RansDecGet(&rans0, TF_SHIFT)];
	RansDecAdvanceSymbol(&rans0, &ptr, &syms[c], TF_SHIFT);
	out_buf[out_end] = c;
	break;

    case 2:
	c = D.R[RansDecGet(&rans0, TF_SHIFT)];
	RansDecAdvanceSymbol(&rans0, &ptr, &syms[c], TF_SHIFT);
	out_buf[out_end] = c;

	c = D.R[RansDecGet(&rans1, TF_SHIFT)];
	RansDecAdvanceSymbol(&rans1, &ptr, &syms[c], TF_SHIFT);
	out_buf[out_end+1] = c;
	break;

    case 3:
	c = D.R[RansDecGet(&rans0, TF_SHIFT)];
	RansDecAdvanceSymbol(&rans0, &ptr, &syms[c], TF_SHIFT);
	out_buf[out_end] = c;

	c = D.R[RansDecGet(&rans1, TF_SHIFT)];
	RansDecAdvanceSymbol(&rans1, &ptr, &syms[c], TF_SHIFT);
	out_buf[out_end+1] = c;

	c = D.R[RansDecGet(&rans2, TF_SHIFT)];
	RansDecAdvanceSymbol(&rans2, &ptr, &syms[c], TF_SHIFT);
	out_buf[out_end+2] = c;
	break;
    }

    *out_size = out_sz;

    if (D.R) free(D.R);

    return (unsigned char *)out_buf;
}